

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall ON_Font::Dump(ON_Font *this,ON_TextLog *dump)

{
  Origin OVar1;
  Type TVar2;
  bool bVar3;
  Weight WVar4;
  Stretch SVar5;
  Style SVar6;
  FamilyKind FVar7;
  uint uVar8;
  wchar_t *pwVar9;
  ON_SHA1_Hash *pOVar10;
  NameLocale name_locale;
  ON_FontMetrics *local_3d0;
  undefined1 auStack_188 [8];
  ON_FontMetrics fm;
  int local_138;
  bool bNormalized;
  int fm_pass;
  uint runtime_sn;
  ON_wString characteristics_hash;
  Type font_figure_type;
  ON_wString local_118;
  ON_wString local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [23];
  Member local_e1;
  undefined1 local_e0 [7];
  Member m;
  ON_FontFaceQuartet q;
  Type outline_figure_type;
  undefined1 local_a0 [16];
  ON_Font *substitute;
  ON_wString rich_text_name;
  ON_wString en_windows_logfont_name;
  ON_wString windows_logfont_name;
  ON_wString quartet_description;
  ON_wString en_postscript_name;
  ON_wString postscript_name;
  ON_wString en_face_name;
  ON_wString face_name;
  ON_wString en_family_name;
  ON_wString family_name;
  ON_wString description;
  ON_wString local_28;
  ON_wString s;
  bool bTextHash;
  ON_TextLog *dump_local;
  ON_Font *this_local;
  
  s.m_s._7_1_ = ON_TextLog::IsTextHash(dump);
  ON_wString::ON_wString(&local_28);
  if ((s.m_s._7_1_ & 1) == 0) {
    Description((ON_Font *)&family_name);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&family_name);
    ON_TextLog::Print(dump,L"Font description = \"%ls\"\n",pwVar9);
    ON_TextLog::PushIndent(dump);
    FamilyName((ON_Font *)&en_family_name);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&en_family_name);
    ON_TextLog::Print(dump,L"Family name = \"%ls\"\n",pwVar9);
    name_locale = (NameLocale)this;
    FamilyName((ON_Font *)&face_name,name_locale);
    bVar3 = ON_wString::IsNotEmpty(&face_name);
    if ((bVar3) && (bVar3 = ::operator!=(&face_name,&en_family_name), bVar3)) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&face_name);
      ON_TextLog::Print(dump,L"Family name (English)= \"%ls\"\n",pwVar9);
    }
    FaceName((ON_Font *)&en_face_name);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&en_face_name);
    ON_TextLog::Print(dump,L"Face name = \"%ls\"\n",pwVar9);
    FaceName((ON_Font *)&postscript_name,name_locale);
    bVar3 = ON_wString::IsNotEmpty(&postscript_name);
    if ((bVar3) && (bVar3 = ::operator!=(&postscript_name,&en_face_name), bVar3)) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&postscript_name);
      ON_TextLog::Print(dump,L"Face name (English)= \"%ls\"\n",pwVar9);
    }
    PostScriptName((ON_Font *)&en_postscript_name);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&en_postscript_name);
    ON_TextLog::Print(dump,L"PostScript name = \"%ls\"\n",pwVar9);
    PostScriptName((ON_Font *)&quartet_description,name_locale);
    bVar3 = ON_wString::IsNotEmpty(&quartet_description);
    if ((bVar3) && (bVar3 = ::operator!=(&quartet_description,&en_postscript_name), bVar3)) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&quartet_description);
      ON_TextLog::Print(dump,L"PostScript name (English)= \"%ls\"\n",pwVar9);
    }
    QuartetDescription((ON_Font *)&windows_logfont_name);
    bVar3 = ON_wString::IsNotEmpty(&windows_logfont_name);
    if (bVar3) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&windows_logfont_name);
      ON_TextLog::Print(dump,L"Quartet = %ls\n",pwVar9);
    }
    WindowsLogfontName((ON_Font *)&en_windows_logfont_name);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&en_windows_logfont_name);
    ON_TextLog::Print(dump,L"Windows LOGFONT name = \"%ls\"\n",pwVar9);
    WindowsLogfontName((ON_Font *)&rich_text_name,name_locale);
    bVar3 = ON_wString::IsNotEmpty(&rich_text_name);
    if ((bVar3) && (bVar3 = ::operator!=(&rich_text_name,&en_windows_logfont_name), bVar3)) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&rich_text_name);
      ON_TextLog::Print(dump,L"Windows LOGFONT name (English)= \"%ls\"\n",pwVar9);
    }
    RichTextFontName((ON_Font *)&substitute,this,false);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&substitute);
    ON_TextLog::Print(dump,L"Rich text name = \"%ls\"\n",pwVar9);
    bVar3 = IsManagedSubstitutedFont(this);
    if ((bVar3) &&
       (local_a0._8_8_ = SubstituteFont(this), (ON_Font *)local_a0._8_8_ != (ON_Font *)0x0)) {
      Description((ON_Font *)local_a0);
      pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_a0);
      ON_TextLog::Print(dump,L"Installed substitute = %ls\n",pwVar9);
      ON_wString::~ON_wString((ON_wString *)local_a0);
    }
    ON_wString::operator=(&local_28,&ON_wString::EmptyString);
    OVar1 = FontOrigin(this);
    switch(OVar1) {
    case Unset:
      break;
    case Unknown:
      ON_wString::operator=(&local_28,L"Unknown");
      break;
    case WindowsFont:
      ON_wString::operator=(&local_28,L"Windows Font");
      break;
    case AppleFont:
      ON_wString::operator=(&local_28,L"Apple Font");
      break;
    default:
      OVar1 = FontOrigin(this);
      ON_wString::FormatToString((wchar_t *)&stack0xffffffffffffff58,L"%u",(ulong)OVar1);
      ON_wString::operator=(&local_28,(ON_wString *)&stack0xffffffffffffff58);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff58);
    }
    bVar3 = ON_wString::IsNotEmpty(&local_28);
    if (bVar3) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_28);
      ON_TextLog::Print(dump,L"Origin = %ls\n",pwVar9);
    }
    ON_wString::operator=(&local_28,&ON_wString::EmptyString);
    TVar2 = OutlineFigureType(this);
    switch(TVar2) {
    case Unset:
      break;
    case Unknown:
      break;
    case SingleStroke:
      ON_wString::operator=(&local_28,L"Engraving - single stroke");
      break;
    case DoubleStroke:
      ON_wString::operator=(&local_28,L"Engraving - double stroke");
      break;
    case Perimeter:
      ON_wString::operator=(&local_28,L"Perimeter");
      break;
    case NotPerimeter:
      ON_wString::operator=(&local_28,L"Not a perimeter");
      break;
    default:
      ON_wString::FormatToString((wchar_t *)&q.m_bold_italic,L"%u",(ulong)TVar2);
      ON_wString::operator=(&local_28,(ON_wString *)&q.m_bold_italic);
      ON_wString::~ON_wString((ON_wString *)&q.m_bold_italic);
      break;
    case Mixed:
      ON_wString::operator=(&local_28,L"Mixed");
    }
    bVar3 = ON_wString::IsNotEmpty(&local_28);
    if (bVar3) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_28);
      ON_TextLog::Print(dump,L"Outline type = %ls\n",pwVar9);
    }
    ON_wString::~ON_wString((ON_wString *)&substitute);
    ON_wString::~ON_wString(&rich_text_name);
    ON_wString::~ON_wString(&en_windows_logfont_name);
    ON_wString::~ON_wString(&windows_logfont_name);
    ON_wString::~ON_wString(&quartet_description);
    ON_wString::~ON_wString(&en_postscript_name);
    ON_wString::~ON_wString(&postscript_name);
    ON_wString::~ON_wString(&en_face_name);
    ON_wString::~ON_wString(&face_name);
    ON_wString::~ON_wString(&en_family_name);
    ON_wString::~ON_wString(&family_name);
  }
  else {
    ON_TextLog::Print(dump,L"Font family name = ...\n");
    ON_TextLog::PushIndent(dump);
    ON_TextLog::Print(dump,
                      L"The font face name and other properties depend on the platform \nor the fonts installed on a particular computer. Information like \nthis is omitted from dumps used for SHA-1 hash caluculations so \nhash values from different platforms and computers can be compared. \n"
                     );
  }
  bVar3 = IsValidPointSize(this->m_point_size);
  if (bVar3) {
    ON_TextLog::Print(dump,L"PointSize = %g\n",SUB84(this->m_point_size,0));
  }
  else {
    ON_TextLog::Print(dump,L"PointSize = annotation default\n");
  }
  FontQuartet((ON_FontFaceQuartet *)local_e0,this);
  local_e1 = ON_FontFaceQuartet::QuartetMember((ON_FontFaceQuartet *)local_e0,this);
  switch(local_e1) {
  case Unset:
  default:
    ON_TextLog::Print(dump,"Quartet: None\n");
    break;
  case Regular:
    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)(local_f8 + 8));
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_f8 + 8));
    ON_TextLog::Print(dump,"Quartet: %ls (Regular member)\n",pwVar9);
    ON_wString::~ON_wString((ON_wString *)(local_f8 + 8));
    break;
  case Bold:
    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_f8);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_f8);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold member)\n",pwVar9);
    ON_wString::~ON_wString((ON_wString *)local_f8);
    break;
  case Italic:
    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)(local_108 + 8));
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_108 + 8));
    ON_TextLog::Print(dump,"Quartet: %ls (Italic member)\n",pwVar9);
    ON_wString::~ON_wString((ON_wString *)(local_108 + 8));
    break;
  case BoldItalic:
    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_108);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_108);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold-Italic member)\n",pwVar9);
    ON_wString::~ON_wString((ON_wString *)local_108);
  }
  WVar4 = FontWeight(this);
  pwVar9 = WeightToWideString(WVar4);
  ON_wString::operator=(&local_28,pwVar9);
  bVar3 = ON_wString::IsEmpty(&local_28);
  if (bVar3) {
    WVar4 = FontWeight(this);
    ON_wString::FormatToString((wchar_t *)&local_110,L"%u",(ulong)WVar4);
    ON_wString::operator=(&local_28,&local_110);
    ON_wString::~ON_wString(&local_110);
  }
  bVar3 = SimulatedWeight(this);
  if (bVar3) {
    ON_wString::operator+=(&local_28,L" (simulated)");
  }
  pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  ON_TextLog::Print(dump,L"Weight = %ls\n",pwVar9);
  SVar5 = FontStretch(this);
  pwVar9 = StretchToWideString(SVar5);
  ON_wString::operator=(&local_28,pwVar9);
  bVar3 = ON_wString::IsEmpty(&local_28);
  if (bVar3) {
    SVar5 = FontStretch(this);
    ON_wString::FormatToString((wchar_t *)&local_118,L"%u",(ulong)SVar5);
    ON_wString::operator=(&local_28,&local_118);
    ON_wString::~ON_wString(&local_118);
  }
  bVar3 = SimulatedStretch(this);
  if (bVar3) {
    ON_wString::operator+=(&local_28,L" (simulated)");
  }
  pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  ON_TextLog::Print(dump,L"Stretch = %ls\n",pwVar9);
  SVar6 = FontStyle(this);
  pwVar9 = StyleToWideString(SVar6);
  ON_wString::operator=(&local_28,pwVar9);
  bVar3 = ON_wString::IsEmpty(&local_28);
  if (bVar3) {
    SVar6 = FontStyle(this);
    ON_wString::FormatToString((wchar_t *)&stack0xfffffffffffffee0,L"%u",(ulong)SVar6);
    ON_wString::operator=(&local_28,(ON_wString *)&stack0xfffffffffffffee0);
    ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffee0);
  }
  bVar3 = SimulatedStyle(this);
  if (bVar3) {
    ON_wString::operator+=(&local_28,L" (simulated)");
  }
  pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  ON_TextLog::Print(dump,L"Style = %ls\n",pwVar9);
  bVar3 = IsUnderlined(this);
  pwVar9 = L"false";
  if (bVar3) {
    pwVar9 = L"true";
  }
  ON_TextLog::Print(dump,L"Underlined = %ls\n",pwVar9);
  bVar3 = IsStrikethrough(this);
  pwVar9 = L"false";
  if (bVar3) {
    pwVar9 = L"true";
  }
  ON_TextLog::Print(dump,L"Strikethrough = %ls\n",pwVar9);
  bVar3 = IsSymbolFont(this);
  pwVar9 = L"false";
  if (bVar3) {
    pwVar9 = L"true";
  }
  ON_TextLog::Print(dump,L"Symbol font = %ls\n",pwVar9);
  characteristics_hash.m_s._7_1_ = OutlineFigureType(this);
  if (characteristics_hash.m_s._7_1_ == SingleStroke) {
    ON_TextLog::Print(dump,L"Engraving font = Single-stroke\n");
  }
  else if (characteristics_hash.m_s._7_1_ == DoubleStroke) {
    ON_TextLog::Print(dump,L"Engraving font = Double-stroke\n");
  }
  FVar7 = ON_PANOSE1::PANOSE1FamilyKind(&this->m_panose1);
  if ((FVar7 != Any) && (FVar7 = ON_PANOSE1::PANOSE1FamilyKind(&this->m_panose1), FVar7 != NoFit)) {
    ON_PANOSE1::Dump(&this->m_panose1,dump);
  }
  if ((s.m_s._7_1_ & 1) == 0) {
    pOVar10 = FontCharacteristicsHash(this);
    ON_SHA1_Hash::ToString((ON_SHA1_Hash *)&fm_pass,SUB81(pOVar10,0));
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fm_pass);
    ON_TextLog::Print(dump,L"Font characteristics SHA-1 hash = %ls\n",pwVar9);
    uVar8 = RuntimeSerialNumber(this);
    if (uVar8 != 0) {
      if (this == &Default) {
        ON_TextLog::Print(dump,L"Managed font <%u> (ON_Font::Default)\n",(ulong)uVar8);
      }
      else {
        bVar3 = IsInstalledFont(this);
        if (bVar3) {
          ON_TextLog::Print(dump,L"Managed font <%u> (face installed on device)\n",(ulong)uVar8);
        }
        else {
          ON_TextLog::Print(dump,L"Managed font <%u> (face not installed on device)\n",(ulong)uVar8)
          ;
        }
      }
      for (local_138 = 0; local_138 < 1; local_138 = local_138 + 1) {
        if (local_138 == 1) {
          local_3d0 = FontMetrics(this);
        }
        else {
          local_3d0 = FontUnitFontMetrics(this);
        }
        auStack_188._0_4_ = local_3d0->m_UPM;
        auStack_188._4_4_ = local_3d0->m_ascent;
        fm.m_UPM = local_3d0->m_descent;
        fm.m_ascent = local_3d0->m_line_space;
        fm.m_descent._0_2_ = local_3d0->m_ascent_of_capital;
        fm.m_descent._2_2_ = local_3d0->m_ascent_of_x;
        fm.m_line_space = local_3d0->m_strikeout_thickness;
        fm._16_4_ = local_3d0->m_strikeout_position;
        fm.m_strikeout_thickness = local_3d0->m_underscore_thickness;
        fm.m_strikeout_position = local_3d0->m_underscore_position;
        fm.m_underscore_thickness = local_3d0->m_reserved1;
        fm.m_underscore_position = *(int *)&local_3d0->m_reserved2;
        fm.m_reserved1 = *(int *)((long)&local_3d0->m_reserved2 + 4);
        fm.m_reserved2._0_4_ = *(undefined4 *)&local_3d0->m_reserved3;
        fm.m_reserved2._4_4_ = *(undefined4 *)((long)&local_3d0->m_reserved3 + 4);
        fm.m_reserved3._0_4_ = (undefined4)local_3d0->m_reserved_ptr;
        fm.m_reserved3._4_4_ = *(undefined4 *)((long)&local_3d0->m_reserved_ptr + 4);
        pwVar9 = L"Font metrics:";
        if (local_138 == 1) {
          pwVar9 = L"Normalized font metrics:";
        }
        ON_TextLog::Print(dump,pwVar9);
        bVar3 = ON_FontMetrics::IsSet((ON_FontMetrics *)auStack_188);
        if (bVar3) {
          ON_TextLog::PrintNewLine(dump);
          ON_TextLog::PushIndent(dump);
          ON_FontMetrics::Dump((ON_FontMetrics *)auStack_188,dump);
          ON_TextLog::PopIndent(dump);
        }
        else {
          ON_TextLog::Print(dump,L" Unset\n");
        }
      }
    }
    ON_wString::~ON_wString((ON_wString *)&fm_pass);
  }
  ON_TextLog::PopIndent(dump);
  ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)local_e0);
  ON_wString::~ON_wString(&local_28);
  return;
}

Assistant:

void ON_Font::Dump(ON_TextLog& dump) const
{
  const bool bTextHash = dump.IsTextHash();

  ON_wString s;

  if (bTextHash)
  {
    dump.Print(L"Font family name = ...\n");
    dump.PushIndent();
    dump.Print(
      L"The font face name and other properties depend on the platform \n"
      "or the fonts installed on a particular computer. Information like \n"
      "this is omitted from dumps used for SHA-1 hash caluculations so \n"
      "hash values from different platforms and computers can be compared. \n"
    );
  }
  else
  {
    const ON_wString description = Description();
    dump.Print(L"Font description = \"%ls\"\n", static_cast<const wchar_t*>( description ));
    dump.PushIndent();
    
    const ON_wString family_name = FamilyName();
    dump.Print(L"Family name = \"%ls\"\n", static_cast<const wchar_t*>(family_name ));
    const ON_wString en_family_name = FamilyName(ON_Font::NameLocale::English);
    if ( en_family_name.IsNotEmpty() && en_family_name != family_name)
      dump.Print(L"Family name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_family_name ));

    const ON_wString face_name = FaceName();
    dump.Print(L"Face name = \"%ls\"\n", static_cast<const wchar_t*>( face_name ));
    const ON_wString en_face_name = FaceName(ON_Font::NameLocale::English);
    if ( en_face_name.IsNotEmpty() && en_face_name != face_name)
      dump.Print(L"Face name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_face_name ));

    const ON_wString postscript_name = PostScriptName();
    dump.Print(L"PostScript name = \"%ls\"\n", static_cast<const wchar_t*>(postscript_name));
    const ON_wString en_postscript_name = PostScriptName(ON_Font::NameLocale::English);
    if ( en_postscript_name.IsNotEmpty() && en_postscript_name != postscript_name)
      dump.Print(L"PostScript name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_postscript_name ));

    const ON_wString quartet_description = this->QuartetDescription();
    if (quartet_description.IsNotEmpty())
      dump.Print(L"Quartet = %ls\n", static_cast<const wchar_t*>(quartet_description));

    const ON_wString windows_logfont_name = WindowsLogfontName();
    dump.Print(L"Windows LOGFONT name = \"%ls\"\n", static_cast<const wchar_t*>(windows_logfont_name));
    const ON_wString en_windows_logfont_name = WindowsLogfontName(ON_Font::NameLocale::English);
    if ( en_windows_logfont_name.IsNotEmpty() && en_windows_logfont_name != windows_logfont_name)
      dump.Print(L"Windows LOGFONT name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_windows_logfont_name ));

    const ON_wString rich_text_name = ON_Font::RichTextFontName(this, false);
    dump.Print(L"Rich text name = \"%ls\"\n", static_cast<const wchar_t*>(rich_text_name));

    if (this->IsManagedSubstitutedFont())
    {
      const ON_Font* substitute = this->SubstituteFont();
      if (nullptr != substitute)
        dump.Print(L"Installed substitute = %ls\n", static_cast<const wchar_t*>(substitute->Description()));
    }

    s = ON_wString::EmptyString;
    switch (this->FontOrigin())
    {
    case ON_Font::Origin::Unset: break;
    case ON_Font::Origin::Unknown: s = L"Unknown"; break;
    case ON_Font::Origin::WindowsFont: s = L"Windows Font"; break;
    case ON_Font::Origin::AppleFont: s = L"Apple Font";  break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontOrigin())); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Origin = %ls\n", static_cast<const wchar_t*>(s));
    }
       
    s = ON_wString::EmptyString;
    const ON_OutlineFigure::Type outline_figure_type = this->OutlineFigureType();
    switch (outline_figure_type)
    {
    case ON_OutlineFigure::Type::Unset: break;
    case ON_OutlineFigure::Type::Unknown: break;
    case ON_OutlineFigure::Type::SingleStroke: s = L"Engraving - single stroke"; break;
    case ON_OutlineFigure::Type::DoubleStroke: s = L"Engraving - double stroke"; break;
    case ON_OutlineFigure::Type::Perimeter: s = L"Perimeter"; break;
    case ON_OutlineFigure::Type::NotPerimeter: s = L"Not a perimeter"; break;
    case ON_OutlineFigure::Type::Mixed: s = L"Mixed"; break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(outline_figure_type)); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Outline type = %ls\n", static_cast<const wchar_t*>(s));
    }
  }

  if (ON_Font::IsValidPointSize(m_point_size))
  {
    dump.Print(L"PointSize = %g\n", m_point_size);
  }
  else
  {
    dump.Print(L"PointSize = annotation default\n");
  }

  const ON_FontFaceQuartet q = this->FontQuartet();
  const ON_FontFaceQuartet::Member m = q.QuartetMember(this);
  switch (m)
  {
  case ON_FontFaceQuartet::Member::Regular:
    dump.Print("Quartet: %ls (Regular member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Bold:
    dump.Print("Quartet: %ls (Bold member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Italic:
    dump.Print("Quartet: %ls (Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::BoldItalic:
    dump.Print("Quartet: %ls (Bold-Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Unset:
  default:
    dump.Print("Quartet: None\n");
    break;
  }


  s = ON_Font::WeightToWideString(FontWeight());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontWeight()));
  if (SimulatedWeight())
    s += L" (simulated)";
  dump.Print(L"Weight = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StretchToWideString(FontStretch());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStretch()));
  if (SimulatedStretch())
    s += L" (simulated)";
  dump.Print(L"Stretch = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StyleToWideString(FontStyle());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStyle()));
  if (SimulatedStyle())
    s += L" (simulated)";
  dump.Print(L"Style = %ls\n", static_cast<const wchar_t*>(s));

  dump.Print(L"Underlined = %ls\n", this->IsUnderlined() ? L"true" : L"false");

  dump.Print(L"Strikethrough = %ls\n", this->IsStrikethrough() ? L"true" : L"false");

  dump.Print(L"Symbol font = %ls\n", this->IsSymbolFont() ? L"true" : L"false");

  const ON_OutlineFigure::Type font_figure_type = this->OutlineFigureType();
  if (ON_OutlineFigure::Type::SingleStroke == font_figure_type)
    dump.Print(L"Engraving font = Single-stroke\n");
  else if (ON_OutlineFigure::Type::DoubleStroke == font_figure_type)
    dump.Print(L"Engraving font = Double-stroke\n");

  if ( 
    ON_PANOSE1::FamilyKind::Any != m_panose1.PANOSE1FamilyKind()
    && ON_PANOSE1::FamilyKind::NoFit != m_panose1.PANOSE1FamilyKind()
    )
  {
    // PANOSE1 may contains some useful information
    m_panose1.Dump(dump);
  }


  if (false == bTextHash)
  {
    const ON_wString characteristics_hash = FontCharacteristicsHash().ToString(true);
    dump.Print(L"Font characteristics SHA-1 hash = %ls\n", static_cast<const wchar_t*>(characteristics_hash));

    unsigned int runtime_sn = RuntimeSerialNumber();
    if (runtime_sn >= 1)
    {
      if (this == &ON_Font::Default)
        dump.Print(L"Managed font <%u> (ON_Font::Default)\n", runtime_sn);
      else if (IsInstalledFont())
      {
        dump.Print(L"Managed font <%u> (face installed on device)\n", runtime_sn);
      }
      else
      {
        dump.Print(L"Managed font <%u> (face not installed on device)\n", runtime_sn);
      }

      for (int fm_pass = 0; fm_pass < 1; fm_pass++)
      {
        const bool bNormalized = (1 == fm_pass);
        const ON_FontMetrics fm
          = bNormalized
          ? FontMetrics()
          : FontUnitFontMetrics();
        dump.Print(bNormalized ? L"Normalized font metrics:" : L"Font metrics:");
        if (fm.IsSet())
        {
          dump.PrintNewLine();
          dump.PushIndent();
          fm.Dump(dump);
          dump.PopIndent();
        }
        else
        {
          dump.Print(L" Unset\n");
        }
      }
    }

#if defined(ON_OS_WINDOWS_GDI)
    {
      const LOGFONT logfont = this->WindowsLogFont(0, nullptr);
      ON_Font::DumpLogfont(&logfont, dump);
    }
#elif defined (ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
    {
      bool bIsSubstituteFont = false;
      CTFontRef apple_font = AppleCTFont(bIsSubstituteFont);
      if (bIsSubstituteFont)
        dump.Print(L"Apple Core Text font (substitute):\n");
      else
        dump.Print(L"Apple Core Text font:\n");
      dump.PushIndent();
      ON_Font::DumpCTFont(apple_font, dump);
      dump.PopIndent();
      if (nullptr != apple_font && ON_Font::Origin::AppleFont == m_font_origin)
      {
        if (m_apple_font_weight_trait >= -1.0 && m_apple_font_weight_trait <= 1.0)
          dump.Print(L"Apple font weight trait = %g\n", m_apple_font_weight_trait);
        if (m_apple_font_width_trait >= -1.0 && m_apple_font_width_trait <= 1.0)
          dump.Print(L"Apple font width trait = %g\n", m_apple_font_width_trait);
      }
    }
#elif defined(OPENNURBS_FREETYPE_SUPPORT)
// Look in opennurbs_system_rumtime.h for the correct place to define OPENNURBS_FREETYPE_SUPPORT.
// Do NOT define OPENNURBS_FREETYPE_SUPPORT here or in your project setting ("makefile").
    if (runtime_sn >= 1)
    {
      // Free Type font details
      DumpFreeType(dump);
    }
#endif
  }
  dump.PopIndent();
}